

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_iTXt(ucvector *out,uint compressed,char *keyword,char *langtag,char *transkey,
                  char *textstring,LodePNGCompressSettings *zlibsettings)

{
  ucvector *puVar1;
  uint uVar2;
  uchar *insize;
  uchar *puVar3;
  uchar *extraout_RAX;
  ulong uVar4;
  uchar *data;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  uchar uVar10;
  uchar *local_58;
  size_t sStack_50;
  undefined8 local_48;
  ucvector *local_38;
  
  local_38 = out;
  insize = (uchar *)strlen(textstring);
  uVar10 = *keyword;
  puVar3 = insize;
  if (uVar10 == '\0') goto LAB_001144f2;
  uVar7 = 0xffffffffffffffff;
  uVar4 = 0;
  uVar6 = 0;
  data = (uchar *)0x0;
  do {
    uVar8 = uVar6 + 1;
    puVar3 = data;
    uVar5 = uVar4;
    if (uVar4 < uVar8) {
      uVar5 = uVar8 * 3 >> 1;
      if (uVar4 * 2 < uVar8) {
        uVar5 = uVar8;
      }
      puVar3 = (uchar *)realloc(data,uVar5);
      if (puVar3 != (uchar *)0x0) goto LAB_0011408e;
    }
    else {
LAB_0011408e:
      uVar4 = uVar5;
      puVar3[uVar6] = uVar10;
      data = puVar3;
      uVar6 = uVar8;
    }
    uVar10 = keyword[uVar7 + 2];
    uVar7 = uVar7 + 1;
  } while (uVar10 != '\0');
  if (0x4e < uVar7) goto LAB_001144f2;
  uVar7 = uVar6 + 1;
  puVar3 = data;
  uVar8 = uVar4;
  if (uVar4 < uVar7) {
    uVar8 = uVar7 * 3 >> 1;
    if (uVar4 * 2 < uVar7) {
      uVar8 = uVar7;
    }
    puVar3 = (uchar *)realloc(data,uVar8);
    uVar5 = uVar7;
    if (puVar3 != (uchar *)0x0) goto LAB_001140f5;
  }
  else {
LAB_001140f5:
    uVar4 = uVar8;
    puVar3[uVar6] = '\0';
    uVar5 = uVar6 + 2;
    data = puVar3;
    uVar6 = uVar7;
  }
  puVar3 = data;
  uVar7 = uVar4;
  if (uVar4 < uVar5) {
    uVar7 = uVar5 * 3 >> 1;
    if (uVar4 * 2 < uVar5) {
      uVar7 = uVar5;
    }
    puVar3 = (uchar *)realloc(data,uVar7);
    if (puVar3 != (uchar *)0x0) goto LAB_00114153;
  }
  else {
LAB_00114153:
    uVar4 = uVar7;
    puVar3[uVar5 - 1] = compressed != 0;
    uVar6 = uVar5;
    uVar5 = uVar5 + 1;
    data = puVar3;
  }
  puVar3 = data;
  uVar7 = uVar4;
  if (uVar4 < uVar5) {
    uVar7 = uVar5 * 3 >> 1;
    if (uVar4 * 2 < uVar5) {
      uVar7 = uVar5;
    }
    puVar3 = (uchar *)realloc(data,uVar7);
    if (puVar3 != (uchar *)0x0) goto LAB_001141a9;
  }
  else {
LAB_001141a9:
    uVar4 = uVar7;
    puVar3[uVar5 - 1] = '\0';
    uVar6 = uVar5;
    data = puVar3;
  }
  uVar10 = *langtag;
  while (uVar10 != '\0') {
    langtag = (char *)((uchar *)langtag + 1);
    uVar7 = uVar6 + 1;
    puVar3 = data;
    uVar8 = uVar4;
    if (uVar4 < uVar7) {
      uVar8 = uVar7 * 3 >> 1;
      if (uVar4 * 2 < uVar7) {
        uVar8 = uVar7;
      }
      puVar3 = (uchar *)realloc(data,uVar8);
      if (puVar3 != (uchar *)0x0) goto LAB_0011420c;
    }
    else {
LAB_0011420c:
      uVar4 = uVar8;
      puVar3[uVar6] = uVar10;
      uVar6 = uVar7;
      data = puVar3;
    }
    uVar10 = *langtag;
  }
  uVar7 = uVar6 + 1;
  puVar3 = data;
  uVar8 = uVar4;
  if (uVar4 < uVar7) {
    uVar8 = uVar7 * 3 >> 1;
    if (uVar4 * 2 < uVar7) {
      uVar8 = uVar7;
    }
    puVar3 = (uchar *)realloc(data,uVar8);
    if (puVar3 != (uchar *)0x0) goto LAB_0011426f;
  }
  else {
LAB_0011426f:
    uVar4 = uVar8;
    puVar3[uVar6] = '\0';
    uVar6 = uVar7;
    data = puVar3;
  }
  uVar10 = *transkey;
  while (uVar10 != '\0') {
    transkey = (char *)((uchar *)transkey + 1);
    uVar7 = uVar6 + 1;
    puVar3 = data;
    uVar8 = uVar4;
    if (uVar4 < uVar7) {
      uVar8 = uVar7 * 3 >> 1;
      if (uVar4 * 2 < uVar7) {
        uVar8 = uVar7;
      }
      puVar3 = (uchar *)realloc(data,uVar8);
      if (puVar3 != (uchar *)0x0) goto LAB_001142cd;
    }
    else {
LAB_001142cd:
      uVar4 = uVar8;
      puVar3[uVar6] = uVar10;
      uVar6 = uVar7;
      data = puVar3;
    }
    uVar10 = *transkey;
  }
  uVar7 = uVar6 + 1;
  puVar3 = data;
  uVar8 = uVar4;
  if (uVar4 < uVar7) {
    uVar8 = uVar7 * 3 >> 1;
    if (uVar4 * 2 < uVar7) {
      uVar8 = uVar7;
    }
    puVar3 = (uchar *)realloc(data,uVar8);
    if (puVar3 != (uchar *)0x0) goto LAB_00114341;
  }
  else {
LAB_00114341:
    uVar4 = uVar8;
    puVar3[uVar6] = '\0';
    uVar6 = uVar7;
    data = puVar3;
  }
  if (compressed == 0) {
    uVar10 = *textstring;
    while (uVar10 != '\0') {
      textstring = (char *)((uchar *)textstring + 1);
      uVar7 = uVar6 + 1;
      puVar3 = data;
      uVar8 = uVar4;
      if (uVar4 < uVar7) {
        uVar8 = uVar7 * 3 >> 1;
        if (uVar4 * 2 < uVar7) {
          uVar8 = uVar7;
        }
        puVar3 = (uchar *)realloc(data,uVar8);
        if (puVar3 != (uchar *)0x0) goto LAB_001143ee;
      }
      else {
LAB_001143ee:
        uVar4 = uVar8;
        puVar3[uVar6] = uVar10;
        uVar6 = uVar7;
        data = puVar3;
      }
      uVar10 = *textstring;
    }
LAB_001144bd:
    puVar1 = local_38;
    uVar2 = lodepng_chunk_create(&local_38->data,&local_38->size,(uint)uVar6,"iTXt",data);
    if (uVar2 == 0) {
      puVar1->allocsize = puVar1->size;
    }
  }
  else {
    local_58 = (uchar *)0x0;
    sStack_50 = 0;
    local_48 = 0;
    if (zlibsettings->custom_zlib ==
        (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
      uVar2 = lodepng_zlib_compress
                        (&local_58,&sStack_50,(uchar *)textstring,(size_t)insize,zlibsettings);
    }
    else {
      uVar2 = (*zlibsettings->custom_zlib)
                        (&local_58,&sStack_50,(uchar *)textstring,(size_t)insize,zlibsettings);
    }
    if ((uVar2 == 0) && (sStack_50 != 0)) {
      sVar9 = 0;
      do {
        uVar10 = local_58[sVar9];
        uVar7 = uVar6 + 1;
        puVar3 = data;
        uVar8 = uVar4;
        if (uVar4 < uVar7) {
          uVar8 = uVar7 * 3 >> 1;
          if (uVar4 * 2 < uVar7) {
            uVar8 = uVar7;
          }
          puVar3 = (uchar *)realloc(data,uVar8);
          if (puVar3 != (uchar *)0x0) goto LAB_00114480;
        }
        else {
LAB_00114480:
          uVar4 = uVar8;
          puVar3[uVar6] = uVar10;
          data = puVar3;
          uVar6 = uVar7;
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != sStack_50);
    }
    sStack_50 = 0;
    local_48 = 0;
    free(local_58);
    if (uVar2 == 0) goto LAB_001144bd;
  }
  free(data);
  puVar3 = extraout_RAX;
LAB_001144f2:
  return (uint)puVar3;
}

Assistant:

static unsigned addChunk_iTXt(ucvector* out, unsigned compressed, const char* keyword, const char* langtag,
	const char* transkey, const char* textstring, LodePNGCompressSettings* zlibsettings)
{
	unsigned error = 0;
	ucvector data;
	size_t i, textsize = strlen(textstring);

	ucvector_init(&data);

	for (i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
	if (i < 1 || i > 79) return 89; /*error: invalid keyword size*/
	ucvector_push_back(&data, 0); /*null termination char*/
	ucvector_push_back(&data, compressed ? 1 : 0); /*compression flag*/
	ucvector_push_back(&data, 0); /*compression method*/
	for (i = 0; langtag[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)langtag[i]);
	ucvector_push_back(&data, 0); /*null termination char*/
	for (i = 0; transkey[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)transkey[i]);
	ucvector_push_back(&data, 0); /*null termination char*/

	if (compressed)
	{
		ucvector compressed_data;
		ucvector_init(&compressed_data);
		error = zlib_compress(&compressed_data.data, &compressed_data.size,
			(unsigned char*)textstring, textsize, zlibsettings);
		if (!error)
		{
			for (i = 0; i != compressed_data.size; ++i) ucvector_push_back(&data, compressed_data.data[i]);
		}
		ucvector_cleanup(&compressed_data);
	}
	else /*not compressed*/
	{
		for (i = 0; textstring[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)textstring[i]);
	}

	if (!error) error = addChunk(out, "iTXt", data.data, data.size);
	ucvector_cleanup(&data);
	return error;
}